

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_file_system_posix.cxx
# Opt level: O0

void xray_re::xr_file_system::split_path(char *path,string *folder,string *name,string *extension)

{
  undefined8 uVar1;
  path local_138;
  string_type local_110;
  path local_f0;
  string_type local_c8;
  path local_98;
  string_type local_70;
  undefined1 local_50 [8];
  CPath p;
  string *extension_local;
  string *name_local;
  string *folder_local;
  char *path_local;
  
  p.super_path._32_8_ = extension;
  CPath::CPath((CPath *)local_50,path);
  if (folder != (string *)0x0) {
    std::filesystem::__cxx11::path::parent_path();
    std::filesystem::__cxx11::path::operator_cast_to_string(&local_70,&local_98);
    std::__cxx11::string::assign((string *)folder);
    std::__cxx11::string::~string((string *)&local_70);
    std::filesystem::__cxx11::path::~path(&local_98);
  }
  if (name != (string *)0x0) {
    std::filesystem::__cxx11::path::stem(&local_f0,(path *)local_50);
    std::filesystem::__cxx11::path::operator_cast_to_string(&local_c8,&local_f0);
    std::__cxx11::string::assign((string *)name);
    std::__cxx11::string::~string((string *)&local_c8);
    std::filesystem::__cxx11::path::~path(&local_f0);
  }
  uVar1 = p.super_path._32_8_;
  if (p.super_path._32_8_ != 0) {
    std::filesystem::__cxx11::path::extension(&local_138,(path *)local_50);
    std::filesystem::__cxx11::path::operator_cast_to_string(&local_110,&local_138);
    std::__cxx11::string::assign((string *)uVar1);
    std::__cxx11::string::~string((string *)&local_110);
    std::filesystem::__cxx11::path::~path(&local_138);
  }
  CPath::~CPath((CPath *)local_50);
  return;
}

Assistant:

void xr_file_system::split_path(const char* path, std::string* folder, std::string* name, std::string* extension)
{
CPath p(path);

	if(folder != nullptr)
		folder->assign(p.parent_path());

	if(name != nullptr)
		name->assign(p.stem());

	if(extension != nullptr)
		extension->assign(p.extension());
}